

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

Statement * __thiscall soul::StructuralParser::parseForLoop(StructuralParser *this)

{
  Scope *pSVar1;
  bool bVar2;
  Block *this_00;
  LoopStatement *s;
  Statement *pSVar3;
  VariableDeclaration *pVVar4;
  Constant *pCVar5;
  Expression *pEVar6;
  Context local_88;
  pool_ptr<soul::AST::VariableDeclaration> v;
  
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c8be9);
  getContext((Context *)&v,this);
  local_88.location.sourceCode.object = (SourceCodeText *)0x0;
  this_00 = allocate<soul::AST::Block,soul::AST::Context,decltype(nullptr)>
                      (this,(Context *)&v,(void **)&local_88);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr((RefCountedPtr<soul::SourceCodeText> *)&v);
  pSVar1 = this->currentScope;
  this->currentScope = &this_00->super_Scope;
  getContext((Context *)&v,this);
  s = allocate<soul::AST::LoopStatement,soul::AST::Context>(this,(Context *)&v);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr((RefCountedPtr<soul::SourceCodeText> *)&v);
  pSVar3 = parseStatement(this);
  AST::Block::addStatement(this_00,pSVar3);
  AST::Block::addStatement(this_00,&s->super_Statement);
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x2c67cb);
  if (bVar2) {
    cast<soul::AST::VariableDeclaration,soul::AST::Statement>((soul *)&v,pSVar3);
    if (v.object == (VariableDeclaration *)0x0) {
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a19e8);
    }
    else {
      (s->rangeLoopInitialiser).object = v.object;
      pVVar4 = pool_ptr<soul::AST::VariableDeclaration>::operator->(&v);
      pVVar4->doNotConstantFold = true;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::skip(&this->super_SOULTokeniser);
    }
  }
  else {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a19e8);
    if (bVar2) {
      local_88.location.sourceCode.object = (SourceCodeText *)0x0;
      local_88.location.location.data = (char *)0x0;
      local_88.parentScope = (Scope *)0x0;
      soul::Value::Value((Value *)&v,true);
      pCVar5 = allocate<soul::AST::Constant,soul::AST::Context,soul::Value>
                         (this,&local_88,(Value *)&v);
      (s->condition).object = &pCVar5->super_Expression;
      soul::Value::~Value((Value *)&v);
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
                ((RefCountedPtr<soul::SourceCodeText> *)&local_88);
    }
    else {
      pEVar6 = parseExpression(this,false);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a19e8);
      (s->condition).object = pEVar6;
    }
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c67cb);
    if (!bVar2) {
      pEVar6 = parseExpression(this,true);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c67cb);
      (s->iterator).object = &pEVar6->super_Statement;
    }
  }
  pSVar3 = parseStatement(this);
  (s->body).object = pSVar3;
  this->currentScope = pSVar1;
  return &this_00->super_Statement;
}

Assistant:

AST::Statement& parseForLoop()
    {
        expect (Operator::openParen);
        auto& block = allocate<AST::Block> (getContext(), nullptr);
        ScopedScope scope (*this, block);
        auto& loopStatement = allocate<AST::LoopStatement> (getContext());
        auto& loopInitialiser = parseStatement();
        block.addStatement (loopInitialiser);
        block.addStatement (loopStatement);

        if (matches (Operator::closeParen))
        {
            if (auto v = cast<AST::VariableDeclaration> (loopInitialiser))
            {
                loopStatement.rangeLoopInitialiser = v;
                v->doNotConstantFold = true;
                skip();
            }
            else
            {
                expect (Operator::semicolon);
            }
        }
        else
        {
            if (matchIf (Operator::semicolon))
                loopStatement.condition = allocate<AST::Constant> (AST::Context(), Value (true));
            else
                loopStatement.condition = matchEndOfStatement (parseExpression());

            if (! matchIf (Operator::closeParen))
                loopStatement.iterator = matchCloseParen (parseExpression (true));
        }

        loopStatement.body = parseStatement();
        return block;
    }